

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O0

int load_test_next_kv(void **key_out,void **val_out,void *aux)

{
  long *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  uint64_t *idx;
  
  sprintf(load_test_next_kv::kk,"k%07lu",*in_RDX);
  sprintf(load_test_next_kv::vv,"v%07lu",*in_RDX);
  *in_RDX = *in_RDX + 1;
  *in_RDI = load_test_next_kv::kk;
  *in_RSI = load_test_next_kv::vv;
  return 0;
}

Assistant:

int load_test_next_kv(void** key_out, void** val_out, void* aux) {
    uint64_t* idx = (uint64_t*)aux;
    static char kk[16];
    static char vv[16];
    sprintf(kk, "k%07lu", *idx);
    sprintf(vv, "v%07lu", *idx);
    (*idx)++;
    *key_out = (void*)kk;
    *val_out = (void*)vv;
    return 0;
}